

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  int *piVar1;
  float *scanline;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  byte bVar7;
  ImFontAtlas *pIVar8;
  ushort *puVar9;
  uchar *puVar10;
  ImFontConfig *pIVar11;
  ImFont *pIVar12;
  long lVar13;
  short sVar14;
  size_t __n;
  undefined1 auVar15 [15];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [16];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [13];
  undefined1 auVar29 [14];
  unkbyte10 Var30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  uint6 uVar38;
  undefined4 uVar39;
  bool bVar40;
  ushort uVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  stbtt_uint32 sVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  stbtt__active_edge *z;
  void *pvVar54;
  ulong uVar55;
  ImWchar *pIVar56;
  stbrp_context *context;
  stbrp_node *psVar57;
  uchar *puVar58;
  void *pvVar59;
  void *pvVar60;
  stbtt__edge *psVar61;
  float *pfVar62;
  stbtt__active_edge *psVar63;
  stbtt__active_edge *psVar64;
  undefined8 *puVar65;
  float *pfVar66;
  Glyph *__dest;
  ImGuiContext *pIVar67;
  bool bVar68;
  float fVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  stbtt__active_edge *psVar73;
  Glyph *pGVar74;
  int iVar75;
  long lVar76;
  long lVar77;
  undefined8 *puVar78;
  size_t __n_00;
  bool bVar79;
  float fVar80;
  stbtt_fontinfo *psVar81;
  uchar uVar82;
  int iVar83;
  long lVar84;
  stbrp_rect *rects;
  stbtt__edge *psVar85;
  ulong uVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  byte *pbVar90;
  long lVar91;
  int iVar92;
  int iVar93;
  undefined8 uVar94;
  ImFontConfig *pIVar95;
  stbtt__edge *psVar96;
  long lVar97;
  long lVar98;
  char *pcVar99;
  byte *pbVar100;
  void *p;
  stbtt__active_edge *psVar101;
  uint uVar102;
  stbtt_uint8 *data;
  void *pvVar103;
  byte bVar104;
  float fVar105;
  float fVar106;
  char cVar111;
  char cVar112;
  float fVar114;
  undefined1 auVar107 [16];
  char cVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  ushort uVar115;
  float fVar116;
  short sVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  ushort uVar120;
  undefined1 auVar119 [16];
  ushort uVar124;
  ushort uVar125;
  undefined1 in_XMM2 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 in_XMM3 [16];
  float fVar126;
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  int y0;
  int ix0;
  float y0_2;
  int x1;
  ImVector<stbrp_rect> extra_rects;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined8 local_408;
  undefined8 uStack_400;
  stbtt_fontinfo *local_3f0;
  long local_3e8;
  uint local_3e0;
  uint local_3dc;
  float local_3d8;
  undefined4 uStack_3d4;
  undefined8 uStack_3d0;
  void *local_3c0;
  void *local_3b8;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  stbtt_pack_context local_3a0;
  undefined1 local_368 [16];
  ImVector<stbrp_rect> local_358;
  void *local_348;
  ulong local_340;
  long local_338;
  uint local_32c;
  uint local_328;
  int local_324;
  int local_320;
  float local_31c;
  float *local_318;
  long local_310;
  uchar *local_308;
  long local_300;
  float local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  long local_2e8;
  stbtt__edge *local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  short *local_2a0;
  long local_298;
  int local_290;
  int local_28c;
  ulong local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  ulong local_238;
  int local_230;
  
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  fVar80 = 0.0;
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  pIVar67 = GImGui;
  iVar83 = (this->ConfigData).Size;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pvVar54 = (*(pIVar67->IO).MemAllocFn)((long)iVar83 * 0x50);
  uVar55 = (ulong)(this->ConfigData).Size;
  if ((long)uVar55 < 1) {
    uVar50 = 0x200;
    if (0 < this->TexDesiredWidth) {
      uVar50 = this->TexDesiredWidth;
    }
    fVar80 = 0.0;
    iVar83 = 0;
  }
  else {
    local_408 = (this->ConfigData).Data;
    uVar88 = 0;
    uVar94 = 0;
    iVar83 = 0;
    do {
      if ((local_408[uVar88].DstFont == (ImFont *)0x0) ||
         (pIVar8 = (local_408[uVar88].DstFont)->ContainerAtlas,
         pIVar8 != this && pIVar8 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4f9,"bool ImFontAtlas::Build()");
      }
      pIVar95 = local_408 + uVar88;
      pbVar100 = (byte *)pIVar95->FontData;
      iVar75 = pIVar95->FontNo;
      bVar104 = *pbVar100;
      local_418._0_8_ = uVar94;
      if (bVar104 < 0x4f) {
        if (bVar104 == 0) {
          if (pbVar100[1] != 1) goto LAB_001528da;
        }
        else if ((bVar104 != 0x31) || (pbVar100[1] != 0)) goto LAB_001528da;
        if ((pbVar100[2] != 0) || (pbVar100[3] != 0)) goto LAB_001528da;
LAB_0014fca9:
        sVar49 = -(uint)(iVar75 != 0);
      }
      else {
        if (bVar104 == 0x4f) {
          if (((pbVar100[1] != 0x54) || (pbVar100[2] != 0x54)) || (pbVar100[3] != 0x4f))
          goto LAB_001528da;
          goto LAB_0014fca9;
        }
        if (bVar104 != 0x74) goto LAB_001528da;
        if (pbVar100[1] != 0x74) {
          if (((pbVar100[1] != 0x79) || (pbVar100[2] != 0x70)) || (pbVar100[3] != 0x31))
          goto LAB_001528da;
          goto LAB_0014fca9;
        }
        if ((pbVar100[2] != 99) || (pbVar100[3] != 0x66)) goto LAB_001528da;
        uVar50 = *(uint *)(pbVar100 + 4);
        uVar50 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8 | uVar50 << 0x18
        ;
        if (((uVar50 != 0x20000) && (uVar50 != 0x10000)) ||
           (uVar50 = *(uint *)(pbVar100 + 8),
           (int)(uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8 | uVar50 << 0x18
                ) <= iVar75)) goto LAB_001528da;
        uVar50 = *(uint *)(pbVar100 + (long)iVar75 * 4 + 0xc);
        sVar49 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8 | uVar50 << 0x18
        ;
      }
      if ((int)sVar49 < 0) {
LAB_001528da:
        __assert_fail("font_offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4fb,"bool ImFontAtlas::Build()");
      }
      *(byte **)((long)pvVar54 + uVar88 * 0x50 + 8) = pbVar100;
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x10) = sVar49;
      sVar42 = stbtt__find_table(pbVar100,sVar49,"cmap");
      sVar43 = stbtt__find_table(pbVar100,sVar49,"loca");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x18) = sVar43;
      sVar44 = stbtt__find_table(pbVar100,sVar49,"head");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x1c) = sVar44;
      sVar45 = stbtt__find_table(pbVar100,sVar49,"glyf");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x20) = sVar45;
      sVar46 = stbtt__find_table(pbVar100,sVar49,"hhea");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x24) = sVar46;
      sVar47 = stbtt__find_table(pbVar100,sVar49,"hmtx");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x28) = sVar47;
      sVar48 = stbtt__find_table(pbVar100,sVar49,"kern");
      *(stbtt_uint32 *)((long)pvVar54 + uVar88 * 0x50 + 0x2c) = sVar48;
      if (((((sVar42 == 0) || (sVar43 == 0)) || (sVar44 == 0)) || ((sVar45 == 0 || (sVar46 == 0))))
         || (sVar47 == 0)) goto LAB_00152788;
      sVar49 = stbtt__find_table(pbVar100,sVar49,"maxp");
      if (sVar49 == 0) {
        uVar50 = 0xffff;
      }
      else {
        uVar50 = (uint)(ushort)(*(ushort *)(pbVar100 + (ulong)sVar49 + 4) << 8 |
                               *(ushort *)(pbVar100 + (ulong)sVar49 + 4) >> 8);
      }
      *(uint *)((long)pvVar54 + uVar88 * 0x50 + 0x14) = uVar50;
      uVar41 = *(ushort *)(pbVar100 + (ulong)sVar42 + 2) << 8 |
               *(ushort *)(pbVar100 + (ulong)sVar42 + 2) >> 8;
      *(undefined4 *)((long)pvVar54 + uVar88 * 0x50 + 0x30) = 0;
      if (uVar41 == 0) goto LAB_00152788;
      uVar50 = sVar42 + 4;
      uVar72 = (ulong)uVar41;
      iVar75 = 0;
      do {
        uVar41 = *(ushort *)(pbVar100 + uVar50) << 8 | *(ushort *)(pbVar100 + uVar50) >> 8;
        if ((uVar41 == 0) ||
           ((uVar41 == 3 &&
            ((uVar41 = *(ushort *)(pbVar100 + (ulong)uVar50 + 2) << 8 |
                       *(ushort *)(pbVar100 + (ulong)uVar50 + 2) >> 8, uVar41 == 10 || (uVar41 == 1)
             ))))) {
          uVar87 = *(uint *)(pbVar100 + (ulong)uVar50 + 4);
          iVar75 = (uVar87 >> 0x18 | (uVar87 & 0xff0000) >> 8 | (uVar87 & 0xff00) << 8 |
                   uVar87 << 0x18) + sVar42;
          *(int *)((long)pvVar54 + uVar88 * 0x50 + 0x30) = iVar75;
        }
        uVar50 = uVar50 + 8;
        uVar72 = uVar72 - 1;
      } while (uVar72 != 0);
      if (iVar75 == 0) goto LAB_00152788;
      *(uint *)((long)pvVar54 + uVar88 * 0x50 + 0x34) =
           (uint)(ushort)(*(ushort *)(pbVar100 + (long)(int)sVar44 + 0x32) << 8 |
                         *(ushort *)(pbVar100 + (long)(int)sVar44 + 0x32) >> 8);
      pIVar56 = pIVar95->GlyphRanges;
      if (pIVar56 == (ushort *)0x0) {
        pIVar56 = GetGlyphRangesDefault::ranges;
        pIVar95->GlyphRanges = GetGlyphRangesDefault::ranges;
      }
      uVar41 = *pIVar56;
      while (uVar41 != 0) {
        if (pIVar56[1] == 0) break;
        fVar80 = (float)(((int)fVar80 - (uint)uVar41) + (uint)pIVar56[1] + 1);
        iVar83 = iVar83 + 1;
        uVar41 = pIVar56[2];
        pIVar56 = pIVar56 + 2;
      }
      uVar88 = uVar88 + 1;
      uVar94 = CONCAT71((int7)((ulong)uVar94 >> 8),uVar55 <= uVar88);
    } while (uVar88 != uVar55);
    uVar50 = this->TexDesiredWidth;
    if ((((int)uVar50 < 1) && (uVar50 = 0x1000, (int)fVar80 < 0xfa1)) &&
       (uVar50 = 0x800, (int)fVar80 < 0x7d1)) {
      uVar50 = (uint)(1000 < (int)fVar80) * 0x200 + 0x200;
    }
  }
  this->TexWidth = uVar50;
  this->TexHeight = 0;
  pIVar67 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  context = (stbrp_context *)(*(pIVar67->IO).MemAllocFn)(0x48);
  pIVar67 = GImGui;
  uVar87 = uVar50 - 1;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  psVar57 = (stbrp_node *)(*(pIVar67->IO).MemAllocFn)((ulong)uVar87 << 4);
  pIVar67 = GImGui;
  auVar119 = _DAT_0018e590;
  if ((context == (stbrp_context *)0x0) || (psVar57 == (stbrp_node *)0x0)) {
    auVar119 = in_XMM2;
    if (context != (stbrp_context *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar67->IO).MemFreeFn)(context);
      auVar119 = in_XMM2;
    }
    pIVar67 = GImGui;
    if (psVar57 != (stbrp_node *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar67->IO).MemFreeFn)(psVar57);
    }
  }
  else {
    local_3a0.user_allocator_context = (void *)0x0;
    local_3a0.height = 0x8000;
    local_3a0.pixels = (uchar *)0x0;
    local_3a0.padding = 1;
    local_3a0.h_oversample = 1;
    local_3a0.v_oversample = 1;
    local_3a0.pack_info = context;
    local_3a0.width = uVar50;
    local_3a0.stride_in_bytes = uVar50;
    local_3a0.nodes = psVar57;
    if (0x10000 < uVar50) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_rect_pack.h"
                    ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar55 = (ulong)(uVar50 - 2);
    if (uVar50 < 3) {
      uVar55 = 0;
      auVar119 = in_XMM2;
    }
    else {
      lVar84 = uVar55 - 1;
      auVar107._8_4_ = (int)lVar84;
      auVar107._0_8_ = lVar84;
      auVar107._12_4_ = (int)((ulong)lVar84 >> 0x20);
      lVar84 = 0;
      auVar107 = auVar107 ^ _DAT_0018e590;
      in_XMM3._8_4_ = 0xffffffff;
      in_XMM3._0_8_ = 0xffffffffffffffff;
      in_XMM3._12_4_ = 0xffffffff;
      auVar108 = _DAT_0018e700;
      do {
        auVar129 = auVar108 ^ auVar119;
        auVar132._0_4_ = -(uint)(auVar107._0_4_ < auVar129._0_4_);
        auVar132._4_4_ = -(uint)(auVar107._4_4_ < auVar129._4_4_);
        auVar132._8_4_ = -(uint)(auVar107._8_4_ < auVar129._8_4_);
        auVar132._12_4_ = -(uint)(auVar107._12_4_ < auVar129._12_4_);
        auVar130._4_4_ = -(uint)(auVar129._4_4_ == auVar107._4_4_);
        auVar130._12_4_ = -(uint)(auVar129._12_4_ == auVar107._12_4_);
        auVar130._0_4_ = auVar130._4_4_;
        auVar130._8_4_ = auVar130._12_4_;
        auVar129._4_4_ = auVar132._4_4_;
        auVar129._0_4_ = auVar132._4_4_;
        auVar129._8_4_ = auVar132._12_4_;
        auVar129._12_4_ = auVar132._12_4_;
        auVar129 = auVar129 | auVar130 & auVar132;
        lVar98 = auVar108._8_8_;
        if ((~auVar129._0_4_ & 1) != 0) {
          *(stbrp_node **)((long)&psVar57->next + lVar84) = psVar57 + auVar108._0_8_ + 1;
        }
        if (((auVar129 ^ in_XMM3) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(stbrp_node **)((long)&psVar57[1].next + lVar84) = psVar57 + (lVar98 - in_XMM3._8_8_);
        }
        auVar108._0_8_ = auVar108._0_8_ + 2;
        auVar108._8_8_ = lVar98 + 2;
        lVar84 = lVar84 + 0x20;
      } while ((ulong)(uVar50 - 1 >> 1) << 5 != lVar84);
    }
    psVar57[uVar55].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = psVar57;
    context->active_head = context->extra;
    context->width = uVar87;
    context->height = 0x7fff;
    context->num_nodes = uVar87;
    context->align = (int)((uVar50 - 2) + uVar87) / (int)uVar87;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (stbrp_coord)uVar87;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (stbrp_node *)0x0;
  }
  local_358.Size = 0;
  local_358.Capacity = 0;
  local_358.Data = (stbrp_rect *)0x0;
  RenderCustomTexData(this,0,&local_358);
  local_3a0.h_oversample = 1;
  local_3a0.v_oversample = 1;
  if (local_358.Size < 1) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x353,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
  }
  stbrp_pack_rects(context,local_358.Data,local_358.Size);
  if (0 < (long)local_358.Size) {
    iVar75 = this->TexHeight;
    lVar84 = 0;
    do {
      if (*(int *)((long)&(local_358.Data)->was_packed + lVar84) != 0) {
        iVar92 = (uint)*(ushort *)((long)&(local_358.Data)->h + lVar84) +
                 (uint)*(ushort *)((long)&(local_358.Data)->y + lVar84);
        if (iVar75 <= iVar92) {
          iVar75 = iVar92;
        }
        this->TexHeight = iVar75;
      }
      lVar84 = lVar84 + 0x10;
    } while ((long)local_358.Size * 0x10 != lVar84);
  }
  pIVar67 = GImGui;
  __n = (long)(int)fVar80 * 0x1c;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_3b8 = (*(pIVar67->IO).MemAllocFn)(__n);
  pIVar67 = GImGui;
  __n_00 = (long)(int)fVar80 << 4;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_3c0 = (*(pIVar67->IO).MemAllocFn)(__n_00);
  pIVar67 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  local_348 = (*(pIVar67->IO).MemAllocFn)((long)iVar83 * 0x28);
  pvVar59 = local_3b8;
  memset(local_3b8,0,__n);
  memset(local_3c0,0,__n_00);
  pvVar60 = local_348;
  iVar75 = 0;
  memset(local_348,0,(long)iVar83 * 0x28);
  fVar69 = 0.0;
  fVar105 = 0.0;
  if (0 < (this->ConfigData).Size) {
    lVar84 = 0;
    local_3d8 = 0.0;
    fVar69 = 0.0;
    uVar55 = 0;
    do {
      pIVar95 = (this->ConfigData).Data;
      psVar81 = (stbtt_fontinfo *)(lVar84 * 0x50 + (long)pvVar54);
      puVar9 = pIVar95[lVar84].GlyphRanges;
      uVar41 = *puVar9;
      if (uVar41 == 0) {
        psVar81[1].data = (uchar *)((long)pvVar60 + (uVar55 & 0xffffffff) * 0x28);
        psVar81[1].fontstart = 0;
        iVar92 = 0;
        uVar88 = uVar55;
      }
      else {
        uVar72 = 0;
        iVar92 = 0;
        do {
          if (puVar9[uVar72 * 2 + 1] == 0) {
            psVar81[1].data = (uchar *)((long)pvVar60 + (uVar55 & 0xffffffff) * 0x28);
            psVar81[1].fontstart = (int)uVar72;
            uVar88 = (uVar55 & 0xffffffff) + uVar72;
            if ((int)uVar72 != 0) goto LAB_00150404;
            goto LAB_0015046e;
          }
          iVar92 = (iVar92 - (uint)uVar41) + (uint)puVar9[uVar72 * 2 + 1] + 1;
          uVar41 = puVar9[uVar72 * 2 + 2];
          uVar72 = uVar72 + 1;
        } while (uVar41 != 0);
        psVar81[1].data = (uchar *)((long)pvVar60 + (uVar55 & 0xffffffff) * 0x28);
        psVar81[1].fontstart = (int)uVar72;
        uVar88 = (ulong)(uint)((int)uVar55 + (int)uVar72);
LAB_00150404:
        fVar105 = pIVar95[lVar84].SizePixels;
        pfVar62 = (float *)((long)pvVar60 + (uVar55 & 0xffffffff) * 0x28);
        uVar55 = 0;
        do {
          *pfVar62 = fVar105;
          uVar41 = puVar9[uVar55 * 2];
          pfVar62[1] = (float)(uint)uVar41;
          iVar75 = (uint)puVar9[uVar55 * 2 + 1] - (uint)uVar41;
          pfVar62[4] = (float)(iVar75 + 1);
          *(void **)(pfVar62 + 6) = (void *)((long)(int)local_3d8 * 0x1c + (long)pvVar59);
          local_3d8 = (float)(iVar75 + (int)local_3d8 + 1);
          uVar55 = uVar55 + 1;
          pfVar62 = pfVar62 + 10;
        } while ((uVar72 & 0xffffffff) != uVar55);
      }
LAB_0015046e:
      iVar75 = (int)uVar88;
      psVar81[1].userdata = (void *)((long)(int)fVar69 * 0x10 + (long)local_3c0);
      stbtt_PackSetOversampling(&local_3a0,pIVar95[lVar84].OversampleH,pIVar95[lVar84].OversampleV);
      uVar94 = local_3a0._32_8_;
      rects = (stbrp_rect *)psVar81[1].userdata;
      local_418._0_8_ = (long)psVar81[1].fontstart;
      if ((long)psVar81[1].fontstart < 1) {
        uVar50 = 0;
      }
      else {
        puVar58 = psVar81[1].data;
        uVar55 = local_3a0._32_8_ & 0xffffffff;
        local_3e8 = CONCAT44(local_3e8._4_4_,(float)((ulong)local_3a0._32_8_ >> 0x20));
        sVar121 = (short)local_3a0.v_oversample;
        sVar14 = (short)local_3a0.padding;
        pIVar95 = (ImFontConfig *)&rects->h;
        lVar98 = 0;
        uVar50 = 0;
        local_368._0_8_ = puVar58;
        local_408 = pIVar95;
        do {
          fVar105 = *(float *)(puVar58 + lVar98 * 0x28);
          if (fVar105 <= 0.0) {
            fVar105 = -fVar105;
            uVar87 = (uint)(ushort)(*(ushort *)(psVar81->data + (long)psVar81->head + 0x12) << 8 |
                                   *(ushort *)(psVar81->data + (long)psVar81->head + 0x12) >> 8);
          }
          else {
            puVar10 = psVar81->data;
            lVar76 = (long)psVar81->hhea;
            uVar87 = ((int)(short)((ushort)puVar10[lVar76 + 4] << 8) | (uint)puVar10[lVar76 + 5]) -
                     ((int)(short)((ushort)puVar10[lVar76 + 6] << 8) | (uint)puVar10[lVar76 + 7]);
          }
          puVar58[lVar98 * 0x28 + 0x20] = (uchar)uVar55;
          puVar58[lVar98 * 0x28 + 0x21] = SUB81(uVar94,4);
          if (0 < *(int *)(puVar58 + lVar98 * 0x28 + 0x10)) {
            fVar116 = (fVar105 / (float)(int)uVar87) * (float)local_3e8;
            pcVar99 = pIVar95->Name + (long)(int)uVar50 * 0x10 + -0x3a;
            lVar76 = 0;
            do {
              iVar51 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar81->data,psVar81->index_map);
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar81,iVar51,(fVar105 / (float)(int)uVar87) * (float)uVar55,fVar116,
                         auVar119._0_4_,in_XMM3._0_4_,(int *)&local_238,(int *)local_428,
                         (int *)&local_3a8,(int *)(local_428 + 0xc));
              *(short *)(pcVar99 + -2) =
                   (((short)(int)local_3a8 + (short)uVar94) - (short)local_238) + sVar14 + -1;
              *(ushort *)pcVar99 =
                   ~(ushort)local_428._0_8_ + (short)local_428._12_4_ + sVar121 + sVar14;
              lVar76 = lVar76 + 1;
              pcVar99 = pcVar99 + 0x10;
            } while (lVar76 < *(int *)(puVar58 + lVar98 * 0x28 + 0x10));
            uVar50 = uVar50 + (int)lVar76;
            pIVar95 = local_408;
            puVar58 = (uchar *)local_368._0_8_;
          }
          lVar98 = lVar98 + 1;
        } while (lVar98 != local_418._0_8_);
        rects = (stbrp_rect *)psVar81[1].userdata;
        pvVar59 = local_3b8;
        pvVar60 = local_348;
      }
      stbrp_pack_rects((stbrp_context *)local_3a0.pack_info,rects,uVar50);
      if (0 < (int)uVar50) {
        iVar51 = this->TexHeight;
        pvVar103 = psVar81[1].userdata;
        lVar98 = 0;
        do {
          if (*(int *)((long)pvVar103 + lVar98 + 0xc) != 0) {
            iVar93 = (uint)*(ushort *)((long)pvVar103 + lVar98 + 6) +
                     (uint)*(ushort *)((long)pvVar103 + lVar98 + 10);
            if (iVar51 <= iVar93) {
              iVar51 = iVar93;
            }
            this->TexHeight = iVar51;
          }
          lVar98 = lVar98 + 0x10;
        } while ((ulong)uVar50 << 4 != lVar98);
      }
      fVar69 = (float)(iVar92 + (int)fVar69);
      lVar84 = lVar84 + 1;
      uVar55 = uVar88;
      fVar105 = local_3d8;
    } while (lVar84 < (this->ConfigData).Size);
  }
  if (fVar69 != fVar80) {
    __assert_fail("buf_rects_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54b,"bool ImFontAtlas::Build()");
  }
  if (fVar105 != fVar80) {
    __assert_fail("buf_packedchars_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54c,"bool ImFontAtlas::Build()");
  }
  if (iVar75 != iVar83) {
    __assert_fail("buf_ranges_n == total_glyph_range_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x54d,"bool ImFontAtlas::Build()");
  }
  uVar50 = this->TexHeight - 1;
  uVar50 = (int)uVar50 >> 1 | uVar50;
  uVar50 = (int)uVar50 >> 2 | uVar50;
  uVar50 = (int)uVar50 >> 4 | uVar50;
  uVar50 = (int)uVar50 >> 8 | uVar50;
  lVar84 = (long)(int)((int)uVar50 >> 0x10 | uVar50) + 1;
  this->TexHeight = (int)lVar84;
  pIVar67 = GImGui;
  iVar83 = this->TexWidth;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  puVar58 = (uchar *)(*(pIVar67->IO).MemAllocFn)(iVar83 * lVar84);
  this->TexPixelsAlpha8 = puVar58;
  memset(puVar58,0,(long)this->TexHeight * (long)this->TexWidth);
  local_3a0.pixels = this->TexPixelsAlpha8;
  local_3a0.height = this->TexHeight;
  if (0 < (this->ConfigData).Size) {
    lVar84 = 0;
    uVar55 = local_3a0._32_8_;
    do {
      local_3a0._32_8_ = uVar55;
      pIVar95 = (this->ConfigData).Data;
      lVar98 = lVar84 * 0x50;
      local_3f0 = (stbtt_fontinfo *)((long)pvVar54 + lVar98);
      local_2e8 = lVar84;
      stbtt_PackSetOversampling(&local_3a0,pIVar95[lVar84].OversampleH,pIVar95[lVar84].OversampleV);
      local_2d0 = (long)*(int *)((long)pvVar54 + lVar98 + 0x48);
      local_288._0_4_ = local_3a0.h_oversample;
      local_288._4_4_ = local_3a0.v_oversample;
      uStack_280 = 0;
      if (0 < local_2d0) {
        lVar84 = *(long *)((long)pvVar54 + lVar98 + 0x38);
        lVar98 = *(long *)((long)pvVar54 + lVar98 + 0x40);
        lVar97 = 0;
        lVar76 = 0;
        local_310 = lVar84;
        local_2d8 = lVar98;
        do {
          local_2f8 = *(float *)(lVar98 + lVar97 * 0x28);
          if (local_2f8 <= 0.0) {
            uStack_2f4 = 0x80000000;
            uStack_2f0 = 0x80000000;
            uStack_2ec = 0x80000000;
            local_2f8 = -local_2f8;
            uVar50 = (uint)(ushort)(*(ushort *)(local_3f0->data + (long)local_3f0->head + 0x12) << 8
                                   | *(ushort *)(local_3f0->data + (long)local_3f0->head + 0x12) >>
                                     8);
          }
          else {
            puVar58 = local_3f0->data;
            lVar77 = (long)local_3f0->hhea;
            uVar50 = ((int)(short)((ushort)puVar58[lVar77 + 4] << 8) | (uint)puVar58[lVar77 + 5]) -
                     ((int)(short)((ushort)puVar58[lVar77 + 6] << 8) | (uint)puVar58[lVar77 + 7]);
            uStack_2f4 = 0;
            uStack_2f0 = 0;
            uStack_2ec = 0;
          }
          local_2f8 = local_2f8 / (float)(int)uVar50;
          lVar77 = lVar98 + lVar97 * 0x28;
          uVar55 = *(ulong *)(lVar77 + 0x20);
          auVar15._8_6_ = 0;
          auVar15._0_8_ = uVar55;
          auVar15[0xe] = (char)(uVar55 >> 0x38);
          auVar17._8_4_ = 0;
          auVar17._0_8_ = uVar55;
          auVar17[0xc] = (char)(uVar55 >> 0x30);
          auVar17._13_2_ = auVar15._13_2_;
          auVar18._8_4_ = 0;
          auVar18._0_8_ = uVar55;
          auVar18._12_3_ = auVar17._12_3_;
          auVar19._8_2_ = 0;
          auVar19._0_8_ = uVar55;
          auVar19[10] = (char)(uVar55 >> 0x28);
          auVar19._11_4_ = auVar18._11_4_;
          auVar20._8_2_ = 0;
          auVar20._0_8_ = uVar55;
          auVar20._10_5_ = auVar19._10_5_;
          auVar22[8] = (char)(uVar55 >> 0x20);
          auVar22._0_8_ = uVar55;
          auVar22._9_6_ = auVar20._9_6_;
          auVar25._7_8_ = 0;
          auVar25._0_7_ = auVar22._8_7_;
          cVar113 = (char)(uVar55 >> 0x18);
          Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),cVar113);
          auVar35._9_6_ = 0;
          auVar35._0_9_ = Var26;
          cVar112 = (char)(uVar55 >> 0x10);
          auVar27._1_10_ = SUB1510(auVar35 << 0x30,5);
          auVar27[0] = cVar112;
          auVar36._11_4_ = 0;
          auVar36._0_11_ = auVar27;
          cVar111 = (char)(uVar55 >> 8);
          auVar28._1_12_ = SUB1512(auVar36 << 0x20,3);
          auVar28[0] = cVar111;
          bVar104 = (byte)uVar55;
          uVar41 = CONCAT11(0,bVar104);
          auVar23._2_13_ = auVar28;
          auVar23._0_2_ = uVar41;
          sVar121 = (short)Var26;
          auVar16._10_2_ = 0;
          auVar16._0_10_ = auVar23._0_10_;
          auVar16._12_2_ = sVar121;
          uVar38 = CONCAT42(auVar16._10_4_,auVar27._0_2_);
          auVar29._6_8_ = 0;
          auVar29._0_6_ = uVar38;
          uVar115 = auVar28._0_2_;
          Var30 = CONCAT82(SUB148(auVar29 << 0x40,6),uVar115);
          auVar21._4_10_ = Var30;
          auVar21._0_4_ = CONCAT22(0,uVar41);
          local_3a0._32_8_ = auVar21._0_8_;
          iVar83 = *(int *)(lVar77 + 0x10);
          if (0 < iVar83) {
            auVar117._0_4_ = (float)CONCAT22(0,uVar41);
            auVar117._4_4_ = (float)(int)Var30;
            auVar117._8_4_ = (float)(int)uVar38;
            auVar117._12_4_ = (float)(auVar16._10_4_ >> 0x10);
            local_258 = divps(_DAT_0018e4d0,auVar117);
            auVar128[0] = -(bVar104 == 0);
            auVar128[1] = -(bVar104 == 0);
            auVar128[2] = -(bVar104 == 0);
            auVar128[3] = -(bVar104 == 0);
            auVar128[4] = -(cVar111 == '\0');
            auVar128[5] = -(cVar111 == '\0');
            auVar128[6] = -(cVar111 == '\0');
            auVar128[7] = -(cVar111 == '\0');
            auVar128[8] = -(cVar112 == '\0');
            auVar128[9] = -(cVar112 == '\0');
            auVar128[10] = -(cVar112 == '\0');
            auVar128[0xb] = -(cVar112 == '\0');
            auVar128[0xc] = -(cVar113 == '\0');
            auVar128[0xd] = -(cVar113 == '\0');
            auVar128[0xe] = -(cVar113 == '\0');
            auVar128[0xf] = -(cVar113 == '\0');
            sVar14 = -auVar27._0_2_;
            sVar121 = -sVar121;
            Var30 = CONCAT64(CONCAT42(CONCAT22(sVar121,sVar121),sVar14),CONCAT22(sVar14,sVar121));
            auVar31._4_8_ = (long)((unkuint10)Var30 >> 0x10);
            auVar31._2_2_ = 1 - uVar115;
            auVar31._0_2_ = 1 - uVar115;
            auVar122._0_4_ = (float)(int)(short)(1 - uVar41);
            auVar122._4_4_ = (float)(auVar31._0_4_ >> 0x10);
            auVar122._8_4_ = (float)((int)((unkuint10)Var30 >> 0x10) >> 0x10);
            auVar122._12_4_ = (float)(int)sVar121;
            auVar118._0_4_ = auVar117._0_4_ + auVar117._0_4_;
            auVar118._4_4_ = auVar117._4_4_ + auVar117._4_4_;
            auVar118._8_4_ = auVar117._8_4_ + auVar117._8_4_;
            auVar118._12_4_ = auVar117._12_4_ + auVar117._12_4_;
            local_248 = divps(auVar122,auVar118);
            local_248 = ~auVar128 & local_248;
            uVar88 = (ulong)uVar41;
            lVar76 = (long)(int)lVar76;
            uVar55 = (ulong)uVar115;
            auVar119._4_4_ = local_258._4_4_;
            auVar119._0_4_ = auVar119._4_4_;
            auVar119._8_4_ = auVar119._4_4_;
            auVar119._12_4_ = auVar119._4_4_;
            local_278 = local_248._4_4_;
            lVar91 = 0;
            local_338 = lVar77;
            local_2c8 = lVar97;
            fStack_274 = local_278;
            fStack_270 = local_278;
            fStack_26c = local_278;
            local_268 = auVar119;
            do {
              psVar81 = local_3f0;
              if (*(int *)(lVar84 + 0xc + lVar76 * 0x10) != 0) {
                lVar84 = lVar76 * 0x10 + lVar84;
                local_2a0 = (short *)(lVar91 * 0x1c + *(long *)(lVar77 + 0x18));
                local_300 = lVar91;
                local_298 = lVar76;
                iVar75 = stbtt_FindGlyphIndex
                                   ((stbtt_fontinfo *)local_3f0->data,local_3f0->index_map);
                uVar94 = *(undefined8 *)(lVar84 + 4);
                auVar108 = pshuflw(ZEXT416((uint)local_3a0.padding),ZEXT416((uint)local_3a0.padding)
                                   ,0);
                uVar115 = (short)uVar94 - auVar108._0_2_;
                uVar120 = (short)((ulong)uVar94 >> 0x10) - auVar108._2_2_;
                uVar124 = (short)((ulong)uVar94 >> 0x20) + auVar108._4_2_;
                uVar125 = (short)((ulong)uVar94 >> 0x30) + auVar108._6_2_;
                *(ushort *)(lVar84 + 4) = uVar115;
                *(ushort *)(lVar84 + 6) = uVar120;
                *(ushort *)(lVar84 + 8) = uVar124;
                *(ushort *)(lVar84 + 10) = uVar125;
                puVar58 = psVar81->data;
                uVar41 = *(ushort *)(puVar58 + (long)psVar81->hhea + 0x22) << 8 |
                         *(ushort *)(puVar58 + (long)psVar81->hhea + 0x22) >> 8;
                iVar83 = psVar81->hmtx;
                lVar98 = (ulong)uVar41 * 4 + (long)iVar83 + -4;
                lVar76 = (ulong)uVar41 * 4 + (long)iVar83 + -3;
                if (iVar75 < (int)(uint)uVar41) {
                  lVar98 = (long)(iVar75 * 4) + (long)iVar83;
                  lVar76 = (long)(iVar75 * 4) + 1 + (long)iVar83;
                }
                local_32c = (uint)puVar58[lVar76];
                local_328 = (uint)puVar58[lVar98];
                fVar105 = (float)uVar88 * local_2f8;
                fVar69 = (float)uVar55 * local_2f8;
                fVar80 = local_2f8;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar81,iVar75,fVar105,fVar69,local_2f8,auVar119._0_4_,&local_320,
                           &local_324,&local_28c,&local_290);
                local_308 = local_3a0.pixels + uVar124;
                local_3dc = local_3a0.stride_in_bytes;
                uVar50 = stbtt_GetGlyphShape(psVar81,iVar75,(stbtt_vertex **)&local_3a8);
                uVar87 = (uint)uVar115 - (int)uVar88;
                uVar102 = uVar87 + 1;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_3f0,iVar75,fVar105,fVar69,fVar80,auVar119._0_4_,
                           (int *)(local_428 + 0xc),(int *)&local_31c,(int *)0x0,(int *)0x0);
                uVar39 = local_428._12_4_;
                pIVar67 = GImGui;
                if (uVar102 != 0) {
                  local_3e0 = (uint)uVar120 - (int)uVar55;
                  iVar83 = local_3e0 + 1;
                  if ((iVar83 != 0) && (0 < (int)uVar50)) {
                    local_308 = local_308 + (int)(uVar125 * local_3dc);
                    lVar98 = CONCAT44(local_3a8._4_4_,(int)local_3a8);
                    local_428._8_4_ = local_31c;
                    fVar80 = fVar69;
                    if (fVar105 <= fVar69) {
                      fVar80 = fVar105;
                    }
                    lVar76 = 0;
                    uVar52 = 0;
                    do {
                      uVar52 = uVar52 + (*(char *)(lVar98 + 8 + lVar76) == '\x01');
                      lVar76 = lVar76 + 10;
                    } while ((ulong)uVar50 * 10 != lVar76);
                    if (uVar52 != 0) {
                      uVar55 = (ulong)uVar52;
                      piVar1 = &(GImGui->IO).MetricsAllocs;
                      *piVar1 = *piVar1 + 1;
                      pvVar59 = (*(pIVar67->IO).MemAllocFn)(uVar55 * 4);
                      if (pvVar59 != (void *)0x0) {
                        bVar68 = false;
                        fVar116 = 0.0;
                        auVar32._8_8_ = 0;
                        auVar32._0_8_ = local_418._8_8_;
                        local_418 = auVar32 << 0x40;
                        fVar106 = 0.0;
                        bVar40 = true;
                        do {
                          bVar79 = bVar40;
                          pIVar67 = GImGui;
                          if (bVar68) {
                            piVar1 = &(GImGui->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + 1;
                            pvVar60 = (*(pIVar67->IO).MemAllocFn)((long)(int)fVar106 << 3);
                            local_418._0_8_ = pvVar60;
                            if (pvVar60 == (void *)0x0) {
                              (*(GImGui->IO).MemFreeFn)((void *)0x0);
                              pIVar67 = GImGui;
                              piVar1 = &(GImGui->IO).MetricsAllocs;
                              *piVar1 = *piVar1 + -1;
                              (*(pIVar67->IO).MemFreeFn)(pvVar59);
                              goto LAB_00151add;
                            }
                          }
                          local_238 = local_238 & 0xffffffff00000000;
                          fVar106 = 0.0;
                          fVar114 = 0.0;
                          uVar88 = 0xffffffff;
                          lVar76 = 0;
                          do {
                            cVar111 = *(char *)(lVar98 + 8 + lVar76);
                            if (cVar111 == '\x03') {
                              fVar131 = (float)(int)*(short *)(lVar98 + 6 + lVar76);
                              auVar119 = ZEXT416((uint)fVar131);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)local_418._0_8_,(int *)&local_238,fVar106,
                                         fVar114,(float)(int)*(short *)(lVar98 + 4 + lVar76),fVar131
                                         ,(float)(int)*(short *)(lVar98 + lVar76),
                                         (float)(int)*(short *)(lVar98 + 2 + lVar76),
                                         (0.35 / fVar80) * (0.35 / fVar80),0);
                              auVar108 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar76)),
                                                 ZEXT416(*(uint *)(lVar98 + lVar76)),0x60);
                              fVar106 = (float)(auVar108._0_4_ >> 0x10);
                              fVar114 = (float)(auVar108._4_4_ >> 0x10);
                            }
                            else {
                              fVar131 = (float)local_238;
                              if (cVar111 == '\x02') {
                                lVar97 = (long)(int)(float)local_238;
                                auVar108 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar76)),
                                                   ZEXT416(*(uint *)(lVar98 + lVar76)),0x60);
                                fVar106 = (float)(auVar108._0_4_ >> 0x10);
                                fVar114 = (float)(auVar108._4_4_ >> 0x10);
                                local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                if ((stbtt__point *)local_418._0_8_ != (stbtt__point *)0x0) {
                                  ((stbtt__point *)(local_418._0_8_ + lVar97 * 8))->x = fVar106;
                                  ((stbtt__point *)(local_418._0_8_ + lVar97 * 8))->y = fVar114;
                                }
                              }
                              else if (cVar111 == '\x01') {
                                if (-1 < (int)uVar88) {
                                  *(int *)((long)pvVar59 + uVar88 * 4) =
                                       (int)(float)local_238 - (int)fVar116;
                                }
                                uVar88 = (ulong)((int)uVar88 + 1);
                                auVar108 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar76)),
                                                   ZEXT416(*(uint *)(lVar98 + lVar76)),0x60);
                                fVar106 = (float)(auVar108._0_4_ >> 0x10);
                                fVar114 = (float)(auVar108._4_4_ >> 0x10);
                                local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                fVar116 = fVar131;
                                if ((stbtt__point *)local_418._0_8_ != (stbtt__point *)0x0) {
                                  ((stbtt__point *)(local_418._0_8_ + (long)(int)fVar131 * 8))->x =
                                       fVar106;
                                  ((stbtt__point *)(local_418._0_8_ + (long)(int)fVar131 * 8))->y =
                                       fVar114;
                                }
                              }
                            }
                            lVar76 = lVar76 + 10;
                          } while ((ulong)uVar50 * 10 != lVar76);
                          *(int *)((long)pvVar59 + (long)(int)uVar88 * 4) =
                               (int)(float)local_238 - (int)fVar116;
                          pIVar67 = GImGui;
                          bVar68 = true;
                          fVar106 = (float)local_238;
                          bVar40 = false;
                        } while (bVar79);
                        uVar94 = local_418._0_8_;
                        if ((void *)local_418._0_8_ != (void *)0x0) {
                          uVar88 = 0;
                          lVar98 = 0;
                          do {
                            lVar98 = (long)(int)lVar98 + (long)*(int *)((long)pvVar59 + uVar88 * 4);
                            uVar88 = uVar88 + 1;
                          } while (uVar55 != uVar88);
                          piVar1 = &(GImGui->IO).MetricsAllocs;
                          *piVar1 = *piVar1 + 1;
                          psVar61 = (stbtt__edge *)(*(pIVar67->IO).MemAllocFn)(lVar98 * 0x14 + 0x14)
                          ;
                          pvVar60 = (void *)uVar94;
                          if (psVar61 != (stbtt__edge *)0x0) {
                            uVar88 = 0;
                            uVar50 = 0;
                            iVar75 = 0;
                            pvVar103 = (void *)uVar94;
                            do {
                              iVar92 = *(int *)((long)pvVar59 + uVar88 * 4);
                              pvVar60 = pvVar103;
                              if (0 < iVar92) {
                                lVar98 = (long)iVar75;
                                uVar86 = (ulong)(iVar92 - 1);
                                uVar72 = 0;
                                iVar51 = iVar92;
                                do {
                                  iVar93 = (int)uVar86;
                                  fVar80 = *(float *)((long)pvVar103 +
                                                     (long)iVar93 * 8 + lVar98 * 8 + 4);
                                  fVar116 = *(float *)(uVar94 + uVar72 * 8 + lVar98 * 8 + 4);
                                  if ((fVar80 != fVar116) || (NAN(fVar80) || NAN(fVar116))) {
                                    iVar51 = (int)uVar72;
                                    if (fVar80 <= fVar116) {
                                      iVar51 = iVar93;
                                      iVar93 = (int)uVar72;
                                    }
                                    psVar61[(int)uVar50].invert = (uint)(fVar116 < fVar80);
                                    uVar4 = *(undefined8 *)
                                             ((long)pvVar103 + (long)iVar93 * 8 + lVar98 * 8);
                                    uVar5 = *(undefined8 *)
                                             ((long)pvVar103 + (long)iVar51 * 8 + lVar98 * 8);
                                    psVar85 = psVar61 + (int)uVar50;
                                    psVar85->x0 = (float)uVar4 * fVar105 + 0.0;
                                    psVar85->y0 = (float)((ulong)uVar4 >> 0x20) * -fVar69 + 0.0;
                                    psVar85->x1 = (float)uVar5 * fVar105 + 0.0;
                                    psVar85->y1 = (float)((ulong)uVar5 >> 0x20) * -fVar69 + 0.0;
                                    uVar50 = uVar50 + 1;
                                    iVar51 = *(int *)((long)pvVar59 + uVar88 * 4);
                                    pvVar60 = (void *)local_418._0_8_;
                                  }
                                  uVar86 = uVar72 & 0xffffffff;
                                  uVar72 = uVar72 + 1;
                                } while ((long)uVar72 < (long)iVar51);
                              }
                              iVar75 = iVar75 + iVar92;
                              uVar88 = uVar88 + 1;
                              pvVar103 = pvVar60;
                            } while (uVar88 != uVar55);
                            stbtt__sort_edges_quicksort(psVar61,uVar50);
                            if (1 < (int)uVar50) {
                              uVar55 = 1;
                              lVar98 = 2;
                              psVar85 = psVar61;
                              do {
                                uVar3 = psVar61[uVar55].x0;
                                uVar6 = psVar61[uVar55].y0;
                                local_230 = psVar61[uVar55].invert;
                                local_238._0_4_ = psVar61[uVar55].x1;
                                local_238._4_4_ = psVar61[uVar55].y1;
                                lVar76 = lVar98;
                                psVar96 = psVar85;
                                do {
                                  if (psVar96->y0 <= (float)uVar6) {
                                    uVar52 = (int)lVar76 - 1;
                                    goto LAB_00151044;
                                  }
                                  psVar96[1].invert = psVar96->invert;
                                  fVar80 = psVar96->y0;
                                  fVar105 = psVar96->x1;
                                  fVar69 = psVar96->y1;
                                  psVar96[1].x0 = psVar96->x0;
                                  psVar96[1].y0 = fVar80;
                                  psVar96[1].x1 = fVar105;
                                  psVar96[1].y1 = fVar69;
                                  lVar76 = lVar76 + -1;
                                  psVar96 = psVar96 + -1;
                                } while (1 < lVar76);
                                uVar52 = 0;
LAB_00151044:
                                if (uVar55 != uVar52) {
                                  psVar61[(int)uVar52].x0 = (float)uVar3;
                                  psVar61[(int)uVar52].y0 = (float)uVar6;
                                  psVar61[(int)uVar52].x1 = (float)local_238;
                                  psVar61[(int)uVar52].y1 = (float)local_238._4_4_;
                                  psVar61[(int)uVar52].invert = local_230;
                                }
                                uVar55 = uVar55 + 1;
                                lVar98 = lVar98 + 1;
                                psVar85 = psVar85 + 1;
                              } while (uVar55 != uVar50);
                            }
                            pIVar67 = GImGui;
                            local_428._0_8_ = (stbtt__active_edge *)0x0;
                            pfVar62 = (float *)&local_238;
                            if (0x40 < (int)uVar102) {
                              piVar1 = &(GImGui->IO).MetricsAllocs;
                              *piVar1 = *piVar1 + 1;
                              pfVar62 = (float *)(*(pIVar67->IO).MemAllocFn)((ulong)uVar102 * 8 + 4)
                              ;
                            }
                            psVar61[(int)uVar50].y0 = (float)(iVar83 + local_428._8_4_) + 1.0;
                            if (local_3e0 < 0x7fffffff) {
                              local_2c0 = (long)(int)uVar102;
                              scanline = pfVar62 + local_2c0;
                              local_318 = scanline + 1;
                              local_2b0 = local_2c0 * 4;
                              local_3d8 = (float)(int)uVar102;
                              local_2b8 = (long)(int)(uVar87 + 2) << 2;
                              local_340 = 0;
                              uVar55 = 0;
                              local_3b0 = (undefined8 *)0x0;
                              iVar83 = 0;
                              psVar101 = (stbtt__active_edge *)0x0;
                              psVar73 = (stbtt__active_edge *)0x0;
                              psVar85 = psVar61;
                              fVar80 = (float)local_428._8_4_;
                              local_2e0 = psVar61;
                              do {
                                local_408 = (ImFontConfig *)
                                            CONCAT44(local_408._4_4_,(float)(int)fVar80);
                                fVar105 = (float)(int)fVar80 + 1.0;
                                local_428._8_4_ = fVar80;
                                local_2a8 = uVar55;
                                memset(pfVar62,0,local_2b0);
                                memset(scanline,0,local_2b8);
                                puVar78 = local_3b0;
                                fVar80 = (float)local_408;
                                if (psVar73 != (stbtt__active_edge *)0x0) {
                                  psVar63 = (stbtt__active_edge *)local_428;
                                  do {
                                    psVar64 = psVar73;
                                    if (psVar73->ey <= fVar80) {
                                      psVar63->next = psVar73->next;
                                      if ((psVar73->direction == 0.0) && (!NAN(psVar73->direction)))
                                      {
                                        __assert_fail("z->direction",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x83b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                      }
                                      psVar73->direction = 0.0;
                                      psVar73->next = psVar101;
                                      psVar64 = psVar63;
                                      psVar101 = psVar73;
                                    }
                                    psVar73 = psVar64->next;
                                    psVar63 = psVar64;
                                  } while (psVar73 != (stbtt__active_edge *)0x0);
                                }
                                fVar69 = psVar85->y0;
                                while (pIVar67 = GImGui, fVar69 <= fVar105) {
                                  fVar116 = psVar85->y1;
                                  puVar65 = puVar78;
                                  if ((fVar69 != fVar116) ||
                                     (psVar73 = psVar101, NAN(fVar69) || NAN(fVar116))) {
                                    if (psVar101 == (stbtt__active_edge *)0x0) {
                                      if (iVar83 == 0) {
                                        piVar1 = &(GImGui->IO).MetricsAllocs;
                                        *piVar1 = *piVar1 + 1;
                                        puVar65 = (undefined8 *)(*(pIVar67->IO).MemAllocFn)(0x6408);
                                        if (puVar65 == (undefined8 *)0x0) goto LAB_0015287d;
                                        *puVar65 = puVar78;
                                        psVar101 = (stbtt__active_edge *)(puVar65 + 0xc7c);
                                        fVar69 = psVar85->y0;
                                        fVar116 = psVar85->y1;
                                        iVar83 = 799;
                                        psVar73 = (stbtt__active_edge *)0x0;
                                        fVar80 = (float)local_408;
                                      }
                                      else {
                                        if (puVar78 == (undefined8 *)0x0) {
LAB_0015287d:
                                          __assert_fail("z != __null",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x6ab,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                        }
                                        lVar98 = (long)iVar83;
                                        iVar83 = iVar83 + -1;
                                        psVar101 = (stbtt__active_edge *)(puVar78 + lVar98 * 4 + -4)
                                        ;
                                        psVar73 = (stbtt__active_edge *)0x0;
                                      }
                                    }
                                    else {
                                      psVar73 = psVar101->next;
                                    }
                                    fVar106 = psVar85->x0;
                                    fVar114 = (psVar85->x1 - fVar106) / (fVar116 - fVar69);
                                    psVar101->fdx = fVar114;
                                    psVar101->fdy =
                                         (float)(-(uint)(fVar114 != 0.0) & (uint)(1.0 / fVar114));
                                    psVar101->fx = ((fVar80 - fVar69) * fVar114 + fVar106) -
                                                   (float)(int)uVar39;
                                    psVar101->direction =
                                         *(float *)(&DAT_00194b80 +
                                                   (ulong)(psVar85->invert == 0) * 4);
                                    psVar101->sy = fVar69;
                                    psVar101->ey = fVar116;
                                    psVar101->next = (stbtt__active_edge *)0x0;
                                    if (fVar116 < fVar80) {
                                      __assert_fail("z->ey >= scan_y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x848,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    psVar101->next = (stbtt__active_edge *)local_428._0_8_;
                                    local_428._0_8_ = psVar101;
                                  }
                                  psVar61 = psVar85 + 1;
                                  psVar85 = psVar85 + 1;
                                  puVar78 = puVar65;
                                  psVar101 = psVar73;
                                  fVar69 = psVar61->y0;
                                }
                                local_3b0 = puVar78;
                                for (psVar73 = (stbtt__active_edge *)local_428._0_8_;
                                    psVar61 = local_2e0, psVar73 != (stbtt__active_edge *)0x0;
                                    psVar73 = psVar73->next) {
                                  fVar69 = psVar73->ey;
                                  if (fVar69 < fVar80) {
                                    __assert_fail("e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x77f,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar116 = psVar73->fx;
                                  auVar133._0_8_ = CONCAT44(0,fVar116);
                                  auVar133._8_8_ = 0;
                                  fVar106 = psVar73->fdx;
                                  if ((fVar106 != 0.0) || (NAN(fVar106))) {
                                    fVar114 = psVar73->sy;
                                    if (fVar105 < fVar114) {
                                      __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x792,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    fVar134 = fVar106 + fVar116;
                                    fVar131 = (float)(~-(uint)(fVar80 < fVar114) & (uint)fVar116 |
                                                     (uint)((fVar114 - fVar80) * fVar106 + fVar116)
                                                     & -(uint)(fVar80 < fVar114));
                                    if ((((fVar131 < 0.0) ||
                                         (fVar127 = (float)(~-(uint)(fVar69 < fVar105) &
                                                            (uint)fVar134 |
                                                           (uint)((fVar69 - fVar80) * fVar106 +
                                                                 fVar116) &
                                                           -(uint)(fVar69 < fVar105)), fVar127 < 0.0
                                         )) || (local_3d8 <= fVar131)) || (local_3d8 <= fVar127)) {
                                      if (uVar87 < 0x7fffffff) {
                                        local_3e8 = CONCAT44(local_3e8._4_4_,fVar106);
                                        local_368 = auVar133;
                                        uVar50 = 0;
                                        do {
                                          fVar116 = (float)(int)uVar50;
                                          uVar52 = uVar50 + 1;
                                          fVar131 = (float)(int)uVar52;
                                          fVar69 = local_368._0_4_;
                                          fVar114 = (fVar116 - fVar69) / fVar106 + fVar80;
                                          fVar106 = (fVar131 - fVar69) / fVar106 + fVar80;
                                          if ((fVar116 <= fVar69) || (fVar134 <= fVar131)) {
                                            if ((fVar116 <= fVar134) || (fVar69 <= fVar131)) {
                                              if (((fVar116 <= fVar69) || (fVar134 <= fVar116)) &&
                                                 ((fVar116 <= fVar134 || (fVar69 <= fVar116)))) {
                                                if (((fVar69 < fVar131) && (fVar131 < fVar134)) ||
                                                   ((fVar116 = fVar69, fVar114 = fVar80,
                                                    fVar134 < fVar131 && (fVar131 < fVar69))))
                                                goto LAB_00151617;
                                                goto LAB_001516ca;
                                              }
                                            }
                                            else {
                                              stbtt__handle_clipped_edge
                                                        (pfVar62,uVar50,psVar73,fVar69,fVar80,
                                                         fVar131,fVar106);
                                              fVar69 = fVar131;
                                              fVar80 = fVar106;
                                            }
                                            stbtt__handle_clipped_edge
                                                      (pfVar62,uVar50,psVar73,fVar69,fVar80,fVar116,
                                                       fVar114);
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      (pfVar62,uVar50,psVar73,fVar69,fVar80,fVar116,
                                                       fVar114);
                                            fVar69 = fVar116;
                                            fVar80 = fVar114;
LAB_00151617:
                                            stbtt__handle_clipped_edge
                                                      (pfVar62,uVar50,psVar73,fVar69,fVar80,fVar131,
                                                       fVar106);
                                            fVar116 = fVar131;
                                            fVar114 = fVar106;
                                          }
LAB_001516ca:
                                          stbtt__handle_clipped_edge
                                                    (pfVar62,uVar50,psVar73,fVar116,fVar114,fVar134,
                                                     fVar105);
                                          fVar106 = (float)local_3e8;
                                          uVar50 = uVar52;
                                          fVar80 = (float)local_408;
                                        } while (uVar102 != uVar52);
                                      }
                                    }
                                    else {
                                      if (fVar114 <= fVar80) {
                                        fVar114 = fVar80;
                                      }
                                      uVar50 = (uint)fVar131;
                                      if (fVar105 <= fVar69) {
                                        fVar69 = fVar105;
                                      }
                                      uVar52 = (uint)fVar127;
                                      if (uVar50 == uVar52) {
                                        if (((int)uVar50 < 0) || ((int)uVar102 <= (int)uVar50)) {
                                          __assert_fail("x >= 0 && x < len",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x7ae,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar55 = (ulong)uVar50;
                                        pfVar62[uVar55] =
                                             (((fVar127 - (float)(int)uVar50) +
                                              (fVar131 - (float)(int)uVar50)) * -0.5 + 1.0) *
                                             psVar73->direction * (fVar69 - fVar114) +
                                             pfVar62[uVar55];
                                        fVar116 = (fVar69 - fVar114) * psVar73->direction;
                                      }
                                      else {
                                        fVar106 = psVar73->fdy;
                                        uVar70 = uVar50;
                                        fVar126 = fVar131;
                                        if (fVar127 < fVar131) {
                                          fVar126 = fVar80 - fVar114;
                                          fVar114 = (fVar80 - fVar69) + fVar105;
                                          fVar106 = -fVar106;
                                          fVar116 = fVar134;
                                          uVar70 = uVar52;
                                          uVar52 = uVar50;
                                          fVar69 = fVar126 + fVar105;
                                          fVar126 = fVar127;
                                          fVar127 = fVar131;
                                        }
                                        iVar75 = uVar70 + 1;
                                        fVar134 = ((float)iVar75 - fVar116) * fVar106 + fVar80;
                                        fVar116 = psVar73->direction;
                                        fVar131 = (fVar134 - fVar114) * fVar116;
                                        lVar98 = (long)(int)uVar70;
                                        pfVar62[lVar98] =
                                             (((fVar126 - (float)(int)uVar70) + 1.0) * -0.5 + 1.0) *
                                             fVar131 + pfVar62[lVar98];
                                        if (uVar52 - iVar75 != 0 && iVar75 <= (int)uVar52) {
                                          do {
                                            pfVar62[lVar98 + 1] =
                                                 fVar106 * fVar116 * 0.5 + fVar131 +
                                                 pfVar62[lVar98 + 1];
                                            fVar131 = fVar131 + fVar106 * fVar116;
                                            lVar98 = lVar98 + 1;
                                          } while (uVar52 - 1 != (int)lVar98);
                                        }
                                        if (1.01 < ABS(fVar131)) {
                                          __assert_fail("fabs(area) <= 1.01f",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                                  ,0x7d3,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar55 = (ulong)(int)uVar52;
                                        pfVar62[uVar55] =
                                             (fVar69 - (fVar106 * (float)(int)(uVar52 - iVar75) +
                                                       fVar134)) *
                                             (((fVar127 - (float)(int)uVar52) + 0.0) * -0.5 + 1.0) *
                                             fVar116 + fVar131 + pfVar62[uVar55];
                                        fVar116 = (fVar69 - fVar114) * fVar116;
                                      }
                                      local_318[uVar55] = fVar116 + local_318[uVar55];
                                    }
                                  }
                                  else if (fVar116 < local_3d8) {
                                    if (0.0 <= fVar116) {
                                      local_368 = auVar133;
                                      stbtt__handle_clipped_edge
                                                (pfVar62,(int)fVar116,psVar73,fVar116,fVar80,fVar116
                                                 ,fVar105);
                                      iVar75 = (int)fVar116 + 1;
                                      auVar123 = local_368;
                                      fVar80 = (float)local_408;
                                    }
                                    else {
                                      iVar75 = 0;
                                      auVar123._8_8_ = 0;
                                      auVar123._0_8_ = auVar133._0_8_;
                                    }
                                    stbtt__handle_clipped_edge
                                              (scanline,iVar75,psVar73,auVar123._0_4_,fVar80,
                                               auVar123._0_4_,fVar105);
                                    fVar80 = (float)local_408;
                                  }
                                }
                                auVar119._0_12_ = ZEXT812(0x437f0000);
                                auVar119._12_4_ = 0;
                                psVar73 = (stbtt__active_edge *)local_428._0_8_;
                                if (uVar87 < 0x7fffffff) {
                                  fVar80 = 0.0;
                                  pfVar66 = pfVar62;
                                  uVar55 = local_340;
                                  lVar98 = local_2c0;
                                  do {
                                    fVar80 = fVar80 + pfVar66[local_2c0];
                                    iVar75 = (int)(ABS(*pfVar66 + fVar80) * 255.0 + 0.5);
                                    uVar82 = (uchar)iVar75;
                                    if (0xfe < iVar75) {
                                      uVar82 = 0xff;
                                    }
                                    local_308[(int)uVar55] = uVar82;
                                    uVar55 = (ulong)((int)uVar55 + 1);
                                    pfVar66 = pfVar66 + 1;
                                    lVar98 = lVar98 + -1;
                                  } while (lVar98 != 0);
                                }
                                for (; psVar73 != (stbtt__active_edge *)0x0; psVar73 = psVar73->next
                                    ) {
                                  psVar73->fx = psVar73->fdx + psVar73->fx;
                                }
                                fVar80 = (float)(local_428._8_4_ + 1);
                                uVar55 = (ulong)((uint)local_2a8 + 1);
                                local_340 = (ulong)((int)local_340 + local_3dc);
                                psVar73 = (stbtt__active_edge *)local_428._0_8_;
                              } while ((uint)local_2a8 != local_3e0);
                              pvVar60 = (void *)local_418._0_8_;
                              pIVar67 = GImGui;
                              puVar78 = local_3b0;
                              while (GImGui = pIVar67, puVar78 != (undefined8 *)0x0) {
                                puVar65 = (undefined8 *)*puVar78;
                                piVar1 = &(pIVar67->IO).MetricsAllocs;
                                *piVar1 = *piVar1 + -1;
                                (*(pIVar67->IO).MemFreeFn)(puVar78);
                                pIVar67 = GImGui;
                                puVar78 = puVar65;
                              }
                            }
                            pIVar67 = GImGui;
                            if (pfVar62 != (float *)&local_238) {
                              if (pfVar62 != (float *)0x0) {
                                piVar1 = &(GImGui->IO).MetricsAllocs;
                                *piVar1 = *piVar1 + -1;
                              }
                              (*(pIVar67->IO).MemFreeFn)(pfVar62);
                            }
                            pIVar67 = GImGui;
                            piVar1 = &(GImGui->IO).MetricsAllocs;
                            *piVar1 = *piVar1 + -1;
                            (*(pIVar67->IO).MemFreeFn)(psVar61);
                          }
                          pIVar67 = GImGui;
                          piVar1 = &(GImGui->IO).MetricsAllocs;
                          *piVar1 = *piVar1 + -1;
                          (*(pIVar67->IO).MemFreeFn)(pvVar59);
                          pIVar67 = GImGui;
                          piVar1 = &(GImGui->IO).MetricsAllocs;
                          *piVar1 = *piVar1 + -1;
                          (*(pIVar67->IO).MemFreeFn)(pvVar60);
                        }
                      }
                    }
                  }
                }
LAB_00151add:
                pIVar67 = GImGui;
                if ((void *)CONCAT44(local_3a8._4_4_,(int)local_3a8) != (void *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsAllocs;
                  *piVar1 = *piVar1 + -1;
                }
                (*(pIVar67->IO).MemFreeFn)((void *)CONCAT44(local_3a8._4_4_,(int)local_3a8));
                uVar50 = local_3a0.h_oversample;
                uVar88 = local_3a0._32_8_ & 0xffffffff;
                uVar72 = (ulong)*(ushort *)(lVar84 + 8);
                uVar41 = *(ushort *)(lVar84 + 10);
                uVar115 = *(ushort *)(lVar84 + 4);
                uVar87 = (uint)uVar115;
                uVar120 = *(ushort *)(lVar84 + 6);
                if (1 < uVar88) {
                  lVar98 = (long)local_3a0.stride_in_bytes;
                  local_238 = 0;
                  uVar102 = 0;
                  if (uVar120 == 0) {
                    uVar120 = 0;
                  }
                  else {
                    puVar58 = local_3a0.pixels +
                              (ulong)uVar41 * lVar98 + (ulong)*(ushort *)(lVar84 + 8);
                    iVar83 = uVar115 - local_3a0.h_oversample;
                    uVar87 = iVar83 + 1;
                    uVar55 = (ulong)uVar87;
                    do {
                      memset(&local_238,0,uVar88);
                      uVar52 = uVar87;
                      switch(uVar50) {
                      case 2:
                        if (iVar83 < 0) {
LAB_00151d19:
                          uVar70 = 0;
                          uVar52 = 0;
                        }
                        else {
                          uVar72 = 0;
                          uVar70 = 0;
                          do {
                            bVar104 = puVar58[uVar72];
                            bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar72 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar72 + 2 & 7)) = bVar104;
                            uVar70 = uVar70 + ((uint)bVar104 - (uint)bVar7);
                            puVar58[uVar72] = (uchar)(uVar70 >> 1);
                            uVar72 = uVar72 + 1;
                          } while (uVar55 != uVar72);
                        }
                        break;
                      case 3:
                        if (iVar83 < 0) goto LAB_00151d19;
                        uVar72 = 0;
                        uVar70 = 0;
                        do {
                          bVar104 = puVar58[uVar72];
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar72 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar72 + 3 & 7)) = bVar104;
                          uVar70 = uVar70 + ((uint)bVar104 - (uint)bVar7);
                          puVar58[uVar72] = (uchar)(uVar70 / 3);
                          uVar72 = uVar72 + 1;
                        } while (uVar55 != uVar72);
                        break;
                      case 4:
                        if (iVar83 < 0) goto LAB_00151d19;
                        uVar72 = 0;
                        uVar70 = 0;
                        do {
                          bVar104 = puVar58[uVar72];
                          uVar86 = (ulong)((uint)uVar72 & 7);
                          *(byte *)((long)&local_238 + (uVar86 ^ 4)) = bVar104;
                          uVar70 = uVar70 + ((uint)bVar104 -
                                            (uint)*(byte *)((long)&local_238 + uVar86));
                          puVar58[uVar72] = (uchar)(uVar70 >> 2);
                          uVar72 = uVar72 + 1;
                        } while (uVar55 != uVar72);
                        break;
                      case 5:
                        if (iVar83 < 0) goto LAB_00151d19;
                        uVar72 = 0;
                        uVar70 = 0;
                        do {
                          bVar104 = puVar58[uVar72];
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar72 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar72 + 5 & 7)) = bVar104;
                          uVar70 = uVar70 + ((uint)bVar104 - (uint)bVar7);
                          puVar58[uVar72] = (uchar)(uVar70 / 5);
                          uVar72 = uVar72 + 1;
                        } while (uVar55 != uVar72);
                        break;
                      default:
                        if (iVar83 < 0) goto LAB_00151d19;
                        uVar72 = 0;
                        uVar70 = 0;
                        do {
                          bVar104 = puVar58[uVar72];
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar72 & 7));
                          *(byte *)((long)&local_238 + (ulong)(uVar50 + (uint)uVar72 & 7)) = bVar104
                          ;
                          uVar70 = uVar70 + ((uint)bVar104 - (uint)bVar7);
                          puVar58[uVar72] = (uchar)(uVar70 / uVar50);
                          uVar72 = uVar72 + 1;
                        } while (uVar55 != uVar72);
                      }
                      if ((int)uVar52 < (int)(uint)uVar115) {
                        uVar72 = (ulong)uVar52;
                        do {
                          if (puVar58[uVar72] != '\0') {
                            __assert_fail("pixels[i] == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                          ,0xada,
                                          "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar70 = uVar70 - *(byte *)((long)&local_238 + (ulong)((uint)uVar72 & 7));
                          puVar58[uVar72] = (uchar)(uVar70 / uVar50);
                          uVar72 = uVar72 + 1;
                        } while ((int)uVar72 < (int)(uint)uVar115);
                      }
                      puVar58 = puVar58 + lVar98;
                      uVar102 = uVar102 + 1;
                    } while (uVar102 != uVar120);
                    uVar72 = (ulong)*(ushort *)(lVar84 + 8);
                    uVar41 = *(ushort *)(lVar84 + 10);
                    uVar87 = (uint)*(ushort *)(lVar84 + 4);
                    uVar120 = *(ushort *)(lVar84 + 6);
                  }
                }
                sVar121 = (short)uVar72;
                uVar50 = local_3a0.v_oversample;
                uVar55 = (ulong)local_3a0.v_oversample;
                if (1 < uVar55) {
                  lVar98 = (long)local_3a0.stride_in_bytes;
                  local_238 = 0;
                  uVar102 = 0;
                  if ((short)uVar87 == 0) {
                    uVar87 = 0;
                  }
                  else {
                    pbVar100 = local_3a0.pixels + (ulong)uVar41 * lVar98 + uVar72;
                    uVar52 = (uint)uVar120;
                    iVar83 = uVar52 - local_3a0.v_oversample;
                    uVar70 = iVar83 + 1;
                    uVar72 = (ulong)uVar70;
                    do {
                      memset(&local_238,0,uVar55);
                      uVar53 = uVar70;
                      switch(uVar50) {
                      case 2:
                        if (iVar83 < 0) {
LAB_00151fab:
                          uVar71 = 0;
                          uVar53 = 0;
                        }
                        else {
                          uVar86 = 0;
                          uVar71 = 0;
                          pbVar90 = pbVar100;
                          do {
                            bVar104 = *pbVar90;
                            bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar86 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar86 + 2 & 7)) = bVar104;
                            uVar71 = uVar71 + ((uint)bVar104 - (uint)bVar7);
                            *pbVar90 = (byte)(uVar71 >> 1);
                            uVar86 = uVar86 + 1;
                            pbVar90 = pbVar90 + lVar98;
                          } while (uVar72 != uVar86);
                        }
                        break;
                      case 3:
                        if (iVar83 < 0) goto LAB_00151fab;
                        uVar86 = 0;
                        uVar71 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar104 = *pbVar90;
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar86 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar86 + 3 & 7)) = bVar104;
                          uVar71 = uVar71 + ((uint)bVar104 - (uint)bVar7);
                          *pbVar90 = (byte)(uVar71 / 3);
                          uVar86 = uVar86 + 1;
                          pbVar90 = pbVar90 + lVar98;
                        } while (uVar72 != uVar86);
                        break;
                      case 4:
                        if (iVar83 < 0) goto LAB_00151fab;
                        uVar86 = 0;
                        uVar71 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar104 = *pbVar90;
                          uVar89 = (ulong)((uint)uVar86 & 7);
                          *(byte *)((long)&local_238 + (uVar89 ^ 4)) = bVar104;
                          uVar71 = uVar71 + ((uint)bVar104 -
                                            (uint)*(byte *)((long)&local_238 + uVar89));
                          *pbVar90 = (byte)(uVar71 >> 2);
                          uVar86 = uVar86 + 1;
                          pbVar90 = pbVar90 + lVar98;
                        } while (uVar72 != uVar86);
                        break;
                      case 5:
                        if (iVar83 < 0) goto LAB_00151fab;
                        uVar86 = 0;
                        uVar71 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar104 = *pbVar90;
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar86 & 7));
                          *(byte *)((long)&local_238 + (ulong)((uint)uVar86 + 5 & 7)) = bVar104;
                          uVar71 = uVar71 + ((uint)bVar104 - (uint)bVar7);
                          *pbVar90 = (byte)(uVar71 / 5);
                          uVar86 = uVar86 + 1;
                          pbVar90 = pbVar90 + lVar98;
                        } while (uVar72 != uVar86);
                        break;
                      default:
                        if (iVar83 < 0) goto LAB_00151fab;
                        uVar86 = 0;
                        uVar71 = 0;
                        pbVar90 = pbVar100;
                        do {
                          bVar104 = *pbVar90;
                          bVar7 = *(byte *)((long)&local_238 + (ulong)((uint)uVar86 & 7));
                          *(byte *)((long)&local_238 + (ulong)(uVar50 + (uint)uVar86 & 7)) = bVar104
                          ;
                          uVar71 = uVar71 + ((uint)bVar104 - (uint)bVar7);
                          *pbVar90 = (byte)(uVar71 / uVar50);
                          uVar86 = uVar86 + 1;
                          pbVar90 = pbVar90 + lVar98;
                        } while (uVar72 != uVar86);
                      }
                      iVar75 = uVar52 - uVar53;
                      if (iVar75 != 0 && (int)uVar53 <= (int)uVar52) {
                        lVar76 = (long)(int)uVar53;
                        pbVar90 = pbVar100 + lVar98 * lVar76;
                        do {
                          if (*pbVar90 != 0) {
                            __assert_fail("pixels[i*stride_in_bytes] == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                                          ,0xb18,
                                          "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar71 = uVar71 - *(byte *)((long)&local_238 + (ulong)((uint)lVar76 & 7));
                          *pbVar90 = (byte)(uVar71 / uVar50);
                          lVar76 = lVar76 + 1;
                          pbVar90 = pbVar90 + lVar98;
                          iVar75 = iVar75 + -1;
                        } while (iVar75 != 0);
                      }
                      pbVar100 = pbVar100 + 1;
                      uVar102 = uVar102 + 1;
                    } while (uVar102 != uVar87);
                    sVar121 = *(short *)(lVar84 + 8);
                    uVar41 = *(ushort *)(lVar84 + 10);
                    uVar87 = (uint)*(ushort *)(lVar84 + 4);
                    uVar120 = *(ushort *)(lVar84 + 6);
                  }
                }
                *local_2a0 = sVar121;
                local_2a0[1] = uVar41;
                local_2a0[2] = sVar121 + (short)uVar87;
                local_2a0[3] = uVar120 + uVar41;
                *(float *)(local_2a0 + 8) =
                     (float)(int)(short)((short)(local_328 << 8) + (short)local_32c) * local_2f8;
                *(ulong *)(local_2a0 + 4) =
                     CONCAT44((float)local_324 * local_258._4_4_ + local_248._4_4_,
                              (float)local_320 * local_258._0_4_ + local_248._0_4_);
                *(float *)(local_2a0 + 10) =
                     (float)(int)(uVar87 + local_320) * local_258._0_4_ + local_248._0_4_;
                *(float *)(local_2a0 + 0xc) =
                     (float)(int)((uint)uVar120 + local_324) * (float)local_268._0_4_ + local_278;
                iVar83 = *(int *)(local_338 + 0x10);
                lVar76 = local_298;
                lVar91 = local_300;
                lVar84 = local_310;
                lVar77 = local_338;
              }
              lVar76 = lVar76 + 1;
              lVar91 = lVar91 + 1;
              lVar98 = local_2d8;
              lVar97 = local_2c8;
            } while (lVar91 < iVar83);
          }
          lVar97 = lVar97 + 1;
        } while (lVar97 != local_2d0);
      }
      local_3a0.h_oversample = (undefined4)local_288;
      local_3a0.v_oversample = local_288._4_4_;
      local_3f0[1].userdata = (void *)0x0;
      lVar84 = local_2e8 + 1;
      uVar55 = local_288;
    } while (lVar84 < (this->ConfigData).Size);
  }
  pIVar67 = GImGui;
  if ((stbrp_node *)local_3a0.nodes != (stbrp_node *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(local_3a0.nodes);
  pIVar67 = GImGui;
  if ((stbrp_context *)local_3a0.pack_info != (stbrp_context *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(local_3a0.pack_info);
  pIVar67 = GImGui;
  if (local_3c0 != (void *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(local_3c0);
  pvVar59 = local_3b8;
  if (0 < (this->ConfigData).Size) {
    lVar84 = 0;
    local_3d8 = 1.0;
    uStack_3d4 = 0x3f800000;
    uStack_3d0 = 0x3f8000003f800000;
    do {
      pIVar11 = (this->ConfigData).Data;
      pIVar95 = pIVar11 + lVar84;
      lVar97 = lVar84 * 0x50;
      pIVar12 = pIVar11[lVar84].DstFont;
      fVar80 = pIVar11[lVar84].SizePixels;
      lVar98 = *(long *)((long)pvVar54 + lVar97 + 8);
      lVar76 = (long)*(int *)((long)pvVar54 + lVar97 + 0x24);
      uVar87 = (int)(short)((ushort)*(byte *)(lVar98 + 4 + lVar76) << 8) |
               (uint)*(byte *)(lVar98 + 5 + lVar76);
      uVar50 = (int)(short)((ushort)*(byte *)(lVar98 + 6 + lVar76) << 8) |
               (uint)*(byte *)(lVar98 + 7 + lVar76);
      fVar105 = fVar80 / (float)(int)(uVar87 - uVar50);
      fVar69 = (float)(int)uVar87 * fVar105;
      bVar104 = pIVar11[lVar84].MergeMode;
      if ((bool)bVar104 == false) {
        pIVar12->ContainerAtlas = this;
        pIVar12->ConfigData = pIVar95;
        pIVar12->ConfigDataCount = 0;
        pIVar12->FontSize = fVar80;
        pIVar12->Ascent = fVar69;
        pIVar12->Descent = fVar105 * (float)(int)(short)uVar50;
        pIVar67 = GImGui;
        if ((pIVar12->Glyphs).Capacity < 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest = (Glyph *)(*(pIVar67->IO).MemAllocFn)(0);
          pGVar74 = (pIVar12->Glyphs).Data;
          if (pGVar74 == (Glyph *)0x0) {
LAB_0015232e:
            pGVar74 = (Glyph *)0x0;
            pIVar67 = GImGui;
          }
          else {
            memcpy(__dest,pGVar74,(long)(pIVar12->Glyphs).Size * 0x28);
            pIVar67 = GImGui;
            pGVar74 = (pIVar12->Glyphs).Data;
            if (pGVar74 == (Glyph *)0x0) goto LAB_0015232e;
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(pIVar67->IO).MemFreeFn)(pGVar74);
          (pIVar12->Glyphs).Data = __dest;
          (pIVar12->Glyphs).Capacity = 0;
          bVar104 = pIVar95->MergeMode;
        }
        (pIVar12->Glyphs).Size = 0;
      }
      pIVar12->ConfigDataCount = pIVar12->ConfigDataCount + 1;
      fVar80 = 0.0;
      if (((bVar104 & 1) != 0) && (pIVar95->MergeGlyphCenterV == true)) {
        fVar80 = (fVar69 - pIVar12->Ascent) * 0.5;
      }
      pIVar12->FallbackGlyph = (Glyph *)0x0;
      iVar83 = *(int *)((long)pvVar54 + lVar97 + 0x48);
      if (0 < iVar83) {
        lVar98 = 0;
        do {
          lVar76 = *(long *)((long)pvVar54 + lVar97 + 0x40);
          if (0 < *(int *)(lVar76 + 0x10 + lVar98 * 0x28)) {
            lVar76 = lVar76 + lVar98 * 0x28;
            lVar91 = 0;
            lVar77 = 0;
            local_3e8 = lVar76;
            do {
              pIVar67 = GImGui;
              lVar13 = *(long *)(lVar76 + 0x18);
              uVar41 = *(ushort *)(lVar13 + lVar91);
              if ((((uVar41 != 0) || (*(short *)(lVar13 + 4 + lVar91) != 0)) ||
                  (*(short *)(lVar13 + 2 + lVar91) != 0)) || (*(short *)(lVar13 + 6 + lVar91) != 0))
              {
                uVar50 = *(uint *)(lVar76 + 4);
                if (pIVar95->MergeMode == true) {
                  uVar55 = (ulong)uVar50 + lVar77 & 0xffff;
                  if (((int)uVar55 < (pIVar12->IndexLookup).Size) &&
                     (uVar115 = (pIVar12->IndexLookup).Data[uVar55], uVar115 != 0xffff)) {
                    pGVar74 = (Glyph *)((long)&((pIVar12->Glyphs).Data)->Codepoint +
                                       (ulong)((uint)uVar115 * 0x28));
                  }
                  else {
                    pGVar74 = pIVar12->FallbackGlyph;
                  }
                  if (pGVar74 != (Glyph *)0x0) goto LAB_0015269f;
                }
                fVar105 = *(float *)(lVar13 + 8 + lVar91);
                fVar69 = *(float *)(lVar13 + 0xc + lVar91);
                fVar116 = *(float *)(lVar13 + 0x14 + lVar91);
                fVar106 = *(float *)(lVar13 + 0x18 + lVar91);
                local_418 = ZEXT416(*(uint *)(lVar13 + 4 + lVar91));
                local_408 = *(ImFontConfig **)&this->TexWidth;
                uStack_400 = 0;
                uVar2 = *(undefined2 *)(lVar13 + 2 + lVar91);
                iVar83 = (pIVar12->Glyphs).Size;
                iVar75 = (pIVar12->Glyphs).Capacity;
                uVar87 = iVar83 + 1;
                if (iVar75 <= iVar83) {
                  if (iVar75 == 0) {
                    uVar102 = 8;
                  }
                  else {
                    uVar102 = iVar75 / 2 + iVar75;
                  }
                  if ((int)uVar102 <= (int)uVar87) {
                    uVar102 = uVar87;
                  }
                  piVar1 = &(GImGui->IO).MetricsAllocs;
                  *piVar1 = *piVar1 + 1;
                  pvVar59 = (*(pIVar67->IO).MemAllocFn)((long)(int)uVar102 * 0x28);
                  local_368._0_8_ = pvVar59;
                  pGVar74 = (pIVar12->Glyphs).Data;
                  if (pGVar74 == (Glyph *)0x0) {
LAB_00152586:
                    pGVar74 = (Glyph *)0x0;
                    pIVar67 = GImGui;
                  }
                  else {
                    memcpy(pvVar59,pGVar74,(long)(pIVar12->Glyphs).Size * 0x28);
                    pIVar67 = GImGui;
                    pGVar74 = (pIVar12->Glyphs).Data;
                    if (pGVar74 == (Glyph *)0x0) goto LAB_00152586;
                    piVar1 = &(GImGui->IO).MetricsAllocs;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*(pIVar67->IO).MemFreeFn)(pGVar74);
                  (pIVar12->Glyphs).Data = (Glyph *)local_368._0_8_;
                  (pIVar12->Glyphs).Capacity = uVar102;
                }
                (pIVar12->Glyphs).Size = uVar87;
                if (iVar83 < 0) {
                  __assert_fail("Size > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                                ,0x35d,
                                "value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
                }
                auVar109._0_8_ = CONCAT44((float)local_408._4_4_,(float)(int)(float)local_408);
                auVar109._8_8_ = auVar109._0_8_;
                auVar24._4_4_ = uStack_3d4;
                auVar24._0_4_ = local_3d8;
                auVar24._8_8_ = uStack_3d0;
                auVar119 = divps(auVar24,auVar109);
                auVar110._12_4_ = local_418._4_4_;
                auVar110._0_12_ = ZEXT412(0);
                auVar33._4_8_ = auVar110._8_8_;
                auVar33._0_4_ = local_418._0_4_;
                auVar37._10_2_ = 0;
                auVar37._0_10_ = auVar33._0_10_ << 0x20;
                auVar37._12_2_ = local_418._2_2_;
                Var30 = CONCAT46(auVar37._10_4_,CONCAT24(local_418._0_2_,local_418._0_4_));
                auVar34._2_10_ = SUB1610(ZEXT616((uint6)((unkuint10)Var30 >> 0x20)) << 0x40,6);
                auVar34._0_2_ = uVar2;
                pGVar74 = (pIVar12->Glyphs).Data;
                pGVar74[(ulong)uVar87 - 1].Codepoint = (short)uVar50 + (short)lVar77;
                pGVar74[(ulong)uVar87 - 1].X0 = fVar105 + 0.0;
                pGVar74[(ulong)uVar87 - 1].X1 = fVar116 + 0.0;
                pfVar62 = &pGVar74[(ulong)uVar87 - 1].U0;
                *pfVar62 = (float)uVar41 * auVar119._0_4_;
                pfVar62[1] = (float)auVar34._0_4_ * auVar119._4_4_;
                pfVar62[2] = (float)(int)((unkuint10)Var30 >> 0x20) * auVar119._8_4_;
                pfVar62[3] = (float)local_418._2_2_ * auVar119._12_4_;
                fVar105 = (float)(int)(pIVar12->Ascent + fVar80 + 0.5);
                pGVar74[(ulong)uVar87 - 1].Y0 = fVar69 + 0.0 + fVar105;
                pGVar74[(ulong)uVar87 - 1].Y1 = fVar106 + 0.0 + fVar105;
                fVar105 = *(float *)(lVar13 + 0x10 + lVar91) + (pIVar95->GlyphExtraSpacing).x;
                pGVar74[(ulong)uVar87 - 1].XAdvance = fVar105;
                lVar76 = local_3e8;
                if (pIVar95->PixelSnapH == true) {
                  pGVar74[(ulong)uVar87 - 1].XAdvance = (float)(int)(fVar105 + 0.5);
                }
              }
LAB_0015269f:
              lVar77 = lVar77 + 1;
              lVar91 = lVar91 + 0x1c;
            } while (lVar77 < *(int *)(lVar76 + 0x10));
            iVar83 = *(int *)((long)pvVar54 + lVar97 + 0x48);
            pvVar59 = local_3b8;
          }
          lVar98 = lVar98 + 1;
        } while (lVar98 < iVar83);
      }
      ImFont::BuildLookupTable(pIVar95->DstFont);
      lVar84 = lVar84 + 1;
    } while (lVar84 < (this->ConfigData).Size);
  }
  pIVar67 = GImGui;
  if (pvVar59 != (void *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(pvVar59);
  pIVar67 = GImGui;
  if (local_348 != (void *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(local_348);
  pIVar67 = GImGui;
  if (pvVar54 != (void *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar67->IO).MemFreeFn)(pvVar54);
  RenderCustomTexData(this,1,&local_358);
  ImVector<stbrp_rect>::~ImVector(&local_358);
  local_418[0] = 1;
LAB_00152788:
  return (bool)(local_418[0] & 1);
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}